

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu1_start(void *hal,HalEncTask *task)

{
  undefined4 uVar1;
  undefined8 uStack_48;
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  HalJpegeCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_start",hal);
  }
  hal_jpege_vepu1_set_extra_info(*hal,(JpegeSyntax *)((long)hal + 0x40),0);
  uVar1 = *(undefined4 *)((long)hal + 0x28);
  rd_cfg._8_8_ = *(undefined8 *)((long)hal + 0x18);
  ctx._4_4_ = mpp_dev_ioctl(*hal,4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    uStack_48 = *(undefined8 *)((long)hal + 0x18);
    rd_cfg.reg._4_4_ = 0;
    rd_cfg.reg._0_4_ = uVar1;
    ctx._4_4_ = mpp_dev_ioctl(*hal,5,&stack0xffffffffffffffb8);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu1","send cmd failed %d\n","hal_jpege_vepu1_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_jpege_vepu1","set register read failed %d\n","hal_jpege_vepu1_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_vepu1","set register write failed %d\n","hal_jpege_vepu1_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_start",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_jpege_vepu1_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    hal_jpege_vepu1_set_extra_info(ctx->dev, &ctx->syntax, 0);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    (void)task;
    return ret;
}